

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::log_assert(ConsoleReporter *this,AssertData *rb)

{
  ConsoleReporter *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  ConsoleReporter *unaff_retaddr;
  AssertData *in_stack_00000018;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  ConsoleReporter *in_stack_ffffffffffffffe0;
  Enum in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  if (((((ulong)(in_RSI->subcasesStack).
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) ||
      ((in_RDI[0xc]._M_device[2].super___mutex_base._M_mutex.__size[0x24] & 1U) != 0)) &&
     ((in_RDI[0xd]._M_device[1].super___mutex_base._M_mutex.__size[0x12] & 1U) == 0)) {
    std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
    logTestStart(unaff_retaddr);
    (**(code **)((long)&in_RDI->_M_device[2].super___mutex_base._M_mutex + 0x20))
              (in_RDI,*(undefined8 *)&in_RSI->hasLoggedCurrentTestStart,
               *(undefined4 *)
                &(in_RSI->subcasesStack).
                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ._M_impl.super__Vector_impl_data._M_start," ");
    successOrFailColoredStringToStream
              (in_RSI,(bool)in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8,
               (char *)in_stack_ffffffffffffffe0);
    fulltext_log_assert_to_stream((ostream *)lock._M_device,in_stack_00000018);
    log_contexts(in_stack_ffffffffffffffe0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11fbe9);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if((!rb.m_failed && !opt.success) || tc->m_no_output)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            logTestStart();

            file_line_to_stream(rb.m_file, rb.m_line, " ");
            successOrFailColoredStringToStream(!rb.m_failed, rb.m_at);

            fulltext_log_assert_to_stream(s, rb);

            log_contexts();
        }